

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O3

void duckdb::ApplyWindowStats
               (WindowBoundary *boundary,FrameDelta *delta,BaseStatistics *base,bool is_start)

{
  StatisticsType SVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  InternalException *pIVar6;
  char *pcVar7;
  string local_40;
  
  switch((ulong)boundary & 0xff) {
  case 0:
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    pcVar7 = "Unknown window end boundary";
    if (is_start) {
      pcVar7 = "Unknown window start boundary";
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,pcVar7,pcVar7 + (ulong)is_start * 2 + 0x1b);
    InternalException::InternalException(pIVar6,&local_40);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 1:
    if (!is_start) goto LAB_00cb1319;
    delta->end = 0;
    break;
  case 2:
    if (is_start) {
LAB_00cb12be:
      pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unsupported window start boundary","");
      InternalException::InternalException(pIVar6,&local_40);
      __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    delta->begin = 0;
    break;
  case 3:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
    break;
  case 4:
    delta->begin = 0;
    delta->end = 0;
    break;
  case 5:
    if (base == (BaseStatistics *)0x0) {
      return;
    }
    SVar1 = BaseStatistics::GetStatsType(base);
    if (SVar1 != NUMERIC_STATS) {
      return;
    }
    bVar2 = NumericStats::HasMinMax(base);
    if (!bVar2) {
      return;
    }
    lVar3 = NumericStats::GetMin<long>(base);
    lVar4 = NumericStats::GetMax<long>(base);
    lVar5 = delta->begin;
    if (lVar4 < delta->end && lVar5 < lVar4) {
      lVar5 = -lVar4;
      delta->begin = lVar5;
    }
    if (delta->end <= lVar3 || lVar3 <= lVar5) {
      return;
    }
    lVar3 = -lVar3;
    goto LAB_00cb12b0;
  case 6:
    if (base == (BaseStatistics *)0x0) {
      return;
    }
    SVar1 = BaseStatistics::GetStatsType(base);
    if (SVar1 != NUMERIC_STATS) {
      return;
    }
    bVar2 = NumericStats::HasMinMax(base);
    if (!bVar2) {
      return;
    }
    NumericStats::GetMin<long>(base);
    lVar3 = NumericStats::GetMax<long>(base);
    if (delta->end <= lVar3) {
      return;
    }
LAB_00cb12b0:
    delta->end = lVar3 + 1;
    break;
  default:
    if (is_start) goto LAB_00cb12be;
LAB_00cb1319:
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported window end boundary","");
    InternalException::InternalException(pIVar6,&local_40);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

static void ApplyWindowStats(const WindowBoundary &boundary, FrameDelta &delta, BaseStatistics *base, bool is_start) {
	// Avoid overflow by clamping to the frame bounds
	auto base_stats = delta;

	switch (boundary) {
	case WindowBoundary::UNBOUNDED_PRECEDING:
		if (is_start) {
			delta.end = 0;
			return;
		}
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
		if (!is_start) {
			delta.begin = 0;
			return;
		}
		break;
	case WindowBoundary::CURRENT_ROW_ROWS:
		delta.begin = delta.end = 0;
		return;
	case WindowBoundary::EXPR_PRECEDING_ROWS:
		if (base && base->GetStatsType() == StatisticsType::NUMERIC_STATS && NumericStats::HasMinMax(*base)) {
			//	Preceding so negative offset from current row
			base_stats.begin = NumericStats::GetMin<int64_t>(*base);
			base_stats.end = NumericStats::GetMax<int64_t>(*base);
			if (delta.begin < base_stats.end && base_stats.end < delta.end) {
				delta.begin = -base_stats.end;
			}
			if (delta.begin < base_stats.begin && base_stats.begin < delta.end) {
				delta.end = -base_stats.begin + 1;
			}
		}
		return;
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		if (base && base->GetStatsType() == StatisticsType::NUMERIC_STATS && NumericStats::HasMinMax(*base)) {
			base_stats.begin = NumericStats::GetMin<int64_t>(*base);
			base_stats.end = NumericStats::GetMax<int64_t>(*base);
			if (base_stats.end < delta.end) {
				delta.end = base_stats.end + 1;
			}
		}
		return;

	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::EXPR_PRECEDING_RANGE:
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		return;
	case WindowBoundary::CURRENT_ROW_GROUPS:
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		return;
	case WindowBoundary::INVALID:
		throw InternalException(is_start ? "Unknown window start boundary" : "Unknown window end boundary");
		break;
	}

	if (is_start) {
		throw InternalException("Unsupported window start boundary");
	} else {
		throw InternalException("Unsupported window end boundary");
	}
}